

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O0

long DataSet::random(void)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  reference pvVar4;
  reference this;
  int in_ECX;
  ulong in_RDX;
  long in_RDI;
  float fVar5;
  int f_2;
  vector<float,_std::allocator<float>_> vector_1;
  int i_1;
  float *f_1;
  iterator __end3;
  iterator __begin3;
  vector<float,_std::allocator<float>_> *__range3;
  vector<float,_std::allocator<float>_> *c;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *__range2;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  aimed_centroids;
  NormalRandomGenerator<float> rg_1;
  int f;
  vector<float,_std::allocator<float>_> vector;
  int i;
  UniformRandomGenerator<float> rg;
  shared_ptr<DataSet> *ds;
  undefined4 in_stack_ffffffffffffd758;
  int in_stack_ffffffffffffd75c;
  undefined4 in_stack_ffffffffffffd760;
  undefined4 in_stack_ffffffffffffd764;
  undefined4 in_stack_ffffffffffffd768;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffd76c;
  allocator_type *in_stack_ffffffffffffd770;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffd778;
  vector<float,_std::allocator<float>_> *f_00;
  DataSet *in_stack_ffffffffffffd780;
  DataSet *this_00;
  undefined4 in_stack_ffffffffffffd788;
  float in_stack_ffffffffffffd78c;
  int local_2820;
  undefined1 local_2819 [25];
  int local_2800;
  undefined1 local_27f9;
  reference local_27f8;
  float *local_27f0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_27e8;
  reference local_27e0;
  reference local_27d8;
  vector<float,_std::allocator<float>_> *local_27d0;
  __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  local_27c8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_27c0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_2798 [210];
  int local_13e8;
  vector<float,_std::allocator<float>_> local_13d0;
  int local_13b8;
  undefined1 local_13b1;
  int local_1c;
  ulong local_18;
  
  local_18 = in_RDX;
  if (in_ECX == -1) {
    UniformRandomGenerator<float>::UniformRandomGenerator
              ((UniformRandomGenerator<float> *)
               CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),
               in_stack_ffffffffffffd75c);
    local_13b1 = 0;
    std::make_shared<DataSet,unsigned_long&>
              ((unsigned_long *)CONCAT44(in_stack_ffffffffffffd78c,in_stack_ffffffffffffd788));
    for (local_13b8 = 0; (ulong)(long)local_13b8 < local_18; local_13b8 = local_13b8 + 1) {
      std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x106e5b)
      ;
      std::allocator<float>::allocator((allocator<float> *)0x106e75);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffd780,
                 (size_type)in_stack_ffffffffffffd778,in_stack_ffffffffffffd770);
      std::allocator<float>::~allocator((allocator<float> *)0x106e9b);
      for (local_13e8 = 0; uVar2 = (ulong)local_13e8,
          peVar3 = std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x106ebd), uVar2 < peVar3->num_features;
          local_13e8 = local_13e8 + 1) {
        fVar5 = UniformRandomGenerator<float>::next((UniformRandomGenerator<float> *)0x106edb);
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&local_13d0,(long)local_13e8);
        *pvVar4 = fVar5;
      }
      std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x106f68)
      ;
      addVector(in_stack_ffffffffffffd780,in_stack_ffffffffffffd778);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffd770);
    }
  }
  else {
    local_1c = in_ECX;
    NormalRandomGenerator<float>::NormalRandomGenerator
              ((NormalRandomGenerator<float> *)
               CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),
               in_stack_ffffffffffffd75c);
    std::allocator<float>::allocator((allocator<float> *)0x10700b);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffd780,
               (size_type)in_stack_ffffffffffffd778,in_stack_ffffffffffffd770);
    std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
              ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x107036);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_ffffffffffffd780,(size_type)in_stack_ffffffffffffd778,
             (value_type *)in_stack_ffffffffffffd770,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768));
    std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
              ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x107064);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffd770);
    std::allocator<float>::~allocator((allocator<float> *)0x10707e);
    local_27c0 = local_2798;
    local_27c8._M_current =
         (vector<float,_std::allocator<float>_> *)
         std::
         vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ::begin((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffd75c,in_stack_ffffffffffffd758));
    local_27d0 = (vector<float,_std::allocator<float>_> *)
                 std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::end((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffd75c,in_stack_ffffffffffffd758));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),
                              (__normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffd75c,in_stack_ffffffffffffd758)),
          bVar1) {
      local_27e0 = __gnu_cxx::
                   __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                   ::operator*(&local_27c8);
      local_27d8 = local_27e0;
      local_27e8._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)
                               CONCAT44(in_stack_ffffffffffffd75c,in_stack_ffffffffffffd758));
      local_27f0 = (float *)std::vector<float,_std::allocator<float>_>::end
                                      ((vector<float,_std::allocator<float>_> *)
                                       CONCAT44(in_stack_ffffffffffffd75c,in_stack_ffffffffffffd758)
                                      );
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffd764,in_stack_ffffffffffffd760),
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffd75c,in_stack_ffffffffffffd758)),
            bVar1) {
        local_27f8 = __gnu_cxx::
                     __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                     operator*(&local_27e8);
        in_stack_ffffffffffffd78c =
             NormalRandomGenerator<float>::next((NormalRandomGenerator<float> *)0x107165);
        *local_27f8 = in_stack_ffffffffffffd78c;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_27e8);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator++(&local_27c8);
    }
    local_27f9 = 0;
    std::make_shared<DataSet,unsigned_long&>
              ((unsigned_long *)CONCAT44(in_stack_ffffffffffffd78c,in_stack_ffffffffffffd788));
    for (local_2800 = 0; (ulong)(long)local_2800 < local_18; local_2800 = local_2800 + 1) {
      peVar3 = std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x107258);
      f_00 = (vector<float,_std::allocator<float>_> *)peVar3->num_features;
      this_00 = (DataSet *)local_2819;
      std::allocator<float>::allocator((allocator<float> *)0x107272);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)this_00,(size_type)f_00,
                 in_stack_ffffffffffffd770);
      std::allocator<float>::~allocator((allocator<float> *)0x107298);
      local_2820 = 0;
      while( true ) {
        in_stack_ffffffffffffd770 = (allocator_type *)(long)local_2820;
        peVar3 = std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1072ba);
        if ((allocator_type *)peVar3->num_features <= in_stack_ffffffffffffd770) break;
        this = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](local_2798,(long)(local_2800 % local_1c));
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](this,(long)local_2820);
        vVar6 = *pvVar4;
        fVar5 = NormalRandomGenerator<float>::next((NormalRandomGenerator<float> *)0x107313);
        fVar5 = vVar6 + fVar5 * 0.25;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_2819 + 1),
                            (long)local_2820);
        *pvVar4 = fVar5;
        local_2820 = local_2820 + 1;
      }
      std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1073c5)
      ;
      addVector(this_00,f_00);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffd770);
    }
    local_27f9 = 1;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_ffffffffffffd770);
  }
  return in_RDI;
}

Assistant:

std::shared_ptr<DataSet> DataSet::random(size_t num_features, size_t num_vectors, int num_clusters) {

  // Fully randomize feature vectors if number of centroids is negative.
  if (num_clusters == -1) {

    UniformRandomGenerator<float> rg(1);

    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  } else {
    NormalRandomGenerator<float> rg(1);
    // Sort of randomize the data to lie around some centroids
    std::vector<std::vector<float>> aimed_centroids(
        static_cast<unsigned long>(num_clusters),
        std::vector<float>(num_features));

    // Generate some random centroids
    for (auto &c : aimed_centroids) {
      for (auto &f: c) {
        f = rg.next();
      }
    }

    // Create a new data set
    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = aimed_centroids[i % num_clusters][f] + 0.25f * rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  }
}